

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int biomesToImage(uchar *pixels,uchar (*biomeColors) [3],int *biomes,uint sx,uint sy,uint pixscale,
                 int flip)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  uchar local_64;
  uchar local_60;
  uchar local_5c;
  uchar *pix;
  int idx;
  uint n;
  uint m;
  uint b;
  uint g;
  uint r;
  int id;
  int containsInvalidBiomes;
  uint j;
  uint i;
  uint pixscale_local;
  uint sy_local;
  uint sx_local;
  int *biomes_local;
  uchar (*biomeColors_local) [3];
  uchar *pixels_local;
  
  containsInvalidBiomes = 0;
  for (j = 0; j < sy; j = j + 1) {
    for (i = 0; i < sx; i = i + 1) {
      uVar2 = biomes[j * sx + i];
      if (((int)uVar2 < 0) || (0xff < (int)uVar2)) {
        containsInvalidBiomes = 1;
        uVar1 = biomeColors[(int)(uVar2 & 0x7f)][0] - 0x28;
        if (uVar1 < 0x100) {
          local_5c = (uchar)uVar1;
        }
        else {
          local_5c = '\0';
        }
        r._0_1_ = local_5c;
        uVar1 = biomeColors[(int)(uVar2 & 0x7f)][1] - 0x28;
        if (uVar1 < 0x100) {
          local_60 = (uchar)uVar1;
        }
        else {
          local_60 = '\0';
        }
        g._0_1_ = local_60;
        uVar2 = biomeColors[(int)(uVar2 & 0x7f)][2] - 0x28;
        if (uVar2 < 0x100) {
          local_64 = (uchar)uVar2;
        }
        else {
          local_64 = '\0';
        }
        b._0_1_ = local_64;
      }
      else {
        r._0_1_ = biomeColors[(int)uVar2][0];
        g._0_1_ = biomeColors[(int)uVar2][1];
        b._0_1_ = biomeColors[(int)uVar2][2];
      }
      for (m = 0; m < pixscale; m = m + 1) {
        for (n = 0; n < pixscale; n = n + 1) {
          if (flip == 0) {
            iVar3 = sx * pixscale * (pixscale * ((sy - 1) - j) + m);
          }
          else {
            iVar3 = sx * pixscale * (pixscale * j + m);
          }
          idx = iVar3 + pixscale * i + n;
          puVar4 = pixels + idx * 3;
          *puVar4 = (uchar)r;
          puVar4[1] = (uchar)g;
          puVar4[2] = (uchar)b;
        }
      }
    }
  }
  return containsInvalidBiomes;
}

Assistant:

int biomesToImage(unsigned char *pixels,
        unsigned char biomeColors[256][3], const int *biomes,
        const unsigned int sx, const unsigned int sy,
        const unsigned int pixscale, const int flip)
{
    unsigned int i, j;
    int containsInvalidBiomes = 0;

    for (j = 0; j < sy; j++)
    {
        for (i = 0; i < sx; i++)
        {
            int id = biomes[j*sx+i];
            unsigned int r, g, b;

            if (id < 0 || id >= 256)
            {
                // This may happen for some intermediate layers
                containsInvalidBiomes = 1;
                r = biomeColors[id&0x7f][0]-40; r = (r>0xff) ? 0x00 : r&0xff;
                g = biomeColors[id&0x7f][1]-40; g = (g>0xff) ? 0x00 : g&0xff;
                b = biomeColors[id&0x7f][2]-40; b = (b>0xff) ? 0x00 : b&0xff;
            }
            else
            {
                r = biomeColors[id][0];
                g = biomeColors[id][1];
                b = biomeColors[id][2];
            }

            unsigned int m, n;
            for (m = 0; m < pixscale; m++) {
                for (n = 0; n < pixscale; n++) {
                    int idx = pixscale * i + n;
                    if (flip)
                        idx += (sx * pixscale) * ((pixscale * j) + m);
                    else
                        idx += (sx * pixscale) * ((pixscale * (sy-1-j)) + m);

                    unsigned char *pix = pixels + 3*idx;
                    pix[0] = (unsigned char)r;
                    pix[1] = (unsigned char)g;
                    pix[2] = (unsigned char)b;
                }
            }
        }
    }

    return containsInvalidBiomes;
}